

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O0

void Extra_ThreshPrintInequalities
               (unsigned_long **pGreaters,unsigned_long **pSmallers,int nChows,int nInequalities)

{
  uint local_28;
  int local_24;
  int k;
  int i;
  int nInequalities_local;
  int nChows_local;
  unsigned_long **pSmallers_local;
  unsigned_long **pGreaters_local;
  
  for (local_28 = 0; (int)local_28 < nInequalities; local_28 = local_28 + 1) {
    printf("\n Inequality [%d] = ",(ulong)local_28);
    for (local_24 = 0; local_24 < nChows; local_24 = local_24 + 1) {
      printf("%ld ",pGreaters[(int)local_28][local_24]);
    }
    printf(" > ");
    for (local_24 = 0; local_24 < nChows; local_24 = local_24 + 1) {
      printf("%ld ",pSmallers[(int)local_28][local_24]);
    }
  }
  return;
}

Assistant:

void Extra_ThreshPrintInequalities(unsigned long ** pGreaters,
        unsigned long ** pSmallers, int nChows, int nInequalities) {
    int i = 0, k = 0;
    for (k = 0; k < nInequalities; k++) {
        printf("\n Inequality [%d] = ", k);
        for (i = 0; i < nChows; i++) {
            printf("%ld ", pGreaters[k][i]);
        }
        printf(" > ");

        for (i = 0; i < nChows; i++) {
            printf("%ld ", pSmallers[k][i]);
        }
    }
}